

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          int num_digits,string_view prefix,basic_format_specs<char> *spec,num_writer f)

{
  alignment aVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  align_spec local_48;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::num_writer>
  local_38;
  
  local_38.prefix.size_ = prefix.size_;
  local_38.prefix.data_ = prefix.data_;
  if (-1 < num_digits) {
    local_38.size_ = (uint)num_digits + local_38.prefix.size_;
    local_38.fill = (char_type)(spec->super_align_spec).fill_;
    aVar1 = (spec->super_align_spec).align_;
    if (aVar1 == ALIGN_NUMERIC) {
      uVar3 = (ulong)(spec->super_align_spec).width_;
      uVar4 = uVar3;
      if (uVar3 < local_38.size_) {
        uVar4 = local_38.size_;
      }
      local_38.padding = 0;
      if (local_38.size_ <= uVar3) {
        local_38.padding = uVar3 - local_38.size_;
      }
      local_48.align_ = (spec->super_align_spec).align_;
      local_48.width_ = (spec->super_align_spec).width_;
      local_48.fill_ = (spec->super_align_spec).fill_;
      local_38.size_ = uVar4;
    }
    else {
      uVar2 = (spec->super_core_format_specs).precision;
      if (num_digits < (int)uVar2) {
        if ((int)(uVar2 - num_digits) < 0) goto LAB_0018cd39;
        local_38.size_ = uVar2 + local_38.prefix.size_;
        local_38.padding = (size_t)(uVar2 - num_digits);
        local_38.fill = '0';
      }
      else {
        local_38.padding = 0;
      }
      local_48.align_ = (spec->super_align_spec).align_;
      local_48.width_ = (spec->super_align_spec).width_;
      local_48.fill_ = (spec->super_align_spec).fill_;
      if (aVar1 == ALIGN_DEFAULT) {
        local_48.align_ = ALIGN_RIGHT;
      }
    }
    local_38.f.abs_value = f.abs_value;
    local_38.f.size = f.size;
    local_38.f.sep = f.sep;
    local_38.f._9_3_ = f._9_3_;
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer>>
              (this,&local_48,&local_38);
    return;
  }
LAB_0018cd39:
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/core.h"
                ,0xd1,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = int]"
               );
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }